

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestProgramEnd(StreamingListener *this,UnitTest *unit_test)

{
  bool bVar1;
  string *in_RDI;
  StreamingListener *unaff_retaddr;
  StreamingListener *in_stack_ffffffffffffffc0;
  string local_30 [8];
  String *in_stack_ffffffffffffffd8;
  string *message;
  
  message = in_RDI;
  bVar1 = UnitTest::Passed((UnitTest *)0x207102);
  String::Format(&stack0xffffffffffffffc0,"event=TestProgramEnd&passed=%d\n",(ulong)bVar1);
  String::operator_cast_to_string(in_stack_ffffffffffffffd8);
  Send(unaff_retaddr,message);
  std::__cxx11::string::~string(local_30);
  String::~String((String *)in_RDI);
  CloseConnection(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void OnTestProgramEnd(const UnitTest& unit_test) {
    // Note that Google Test current only report elapsed time for each
    // test iteration, not for the entire test program.
    Send(String::Format("event=TestProgramEnd&passed=%d\n",
                        unit_test.Passed()));

    // Notify the streaming server to stop.
    CloseConnection();
  }